

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall t_javame_generator::~t_javame_generator(t_javame_generator *this)

{
  t_javame_generator *this_local;
  
  ~t_javame_generator(this);
  operator_delete(this);
  return;
}

Assistant:

t_javame_generator(t_program* program,
                     const std::map<std::string, std::string>& parsed_options,
                     const std::string& option_string)
    : t_oop_generator(program) {
    (void)parsed_options;
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    /* no options yet */
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      throw "unknown option javame:" + iter->first;
    }

    out_dir_base_ = "gen-javame";
  }